

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

void __thiscall
llvm::DWARFVerifier::DWARFVerifier
          (DWARFVerifier *this,raw_ostream *S,DWARFContext *D,DIDumpOptions DumpOpts)

{
  bool bVar1;
  int iVar2;
  DWARFObject *pDVar3;
  undefined4 extraout_var;
  ObjectFile *F;
  DWARFContext *D_local;
  raw_ostream *S_local;
  DWARFVerifier *this_local;
  Binary *this_00;
  
  this->OS = S;
  this->DCtx = D;
  (this->DumpOpts).ShowChildren = DumpOpts.ShowChildren;
  (this->DumpOpts).ShowParents = DumpOpts.ShowParents;
  (this->DumpOpts).ShowForm = DumpOpts.ShowForm;
  (this->DumpOpts).SummarizeTypes = DumpOpts.SummarizeTypes;
  (this->DumpOpts).Verbose = DumpOpts.Verbose;
  (this->DumpOpts).DisplayRawContents = DumpOpts.DisplayRawContents;
  *(undefined2 *)&(this->DumpOpts).field_0x16 = DumpOpts._22_2_;
  (this->DumpOpts).DumpType = DumpOpts.DumpType;
  (this->DumpOpts).ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
  (this->DumpOpts).ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
  (this->DumpOpts).Version = DumpOpts.Version;
  (this->DumpOpts).AddrSize = DumpOpts.AddrSize;
  (this->DumpOpts).ShowAddresses = DumpOpts.ShowAddresses;
  std::
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  ::map(&this->ReferenceToDIEOffsets);
  this->NumDebugLineErrors = 0;
  this->IsObjectFile = false;
  this->IsMachOObject = false;
  pDVar3 = DWARFContext::getDWARFObj(this->DCtx);
  iVar2 = (*pDVar3->_vptr_DWARFObject[3])();
  this_00 = (Binary *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (Binary *)0x0) {
    iVar2 = (*this_00->_vptr_Binary[0x31])();
    this->IsObjectFile = (bool)((byte)iVar2 & 1);
    bVar1 = object::Binary::isMachO(this_00);
    this->IsMachOObject = bVar1;
  }
  return;
}

Assistant:

DWARFVerifier::DWARFVerifier(raw_ostream &S, DWARFContext &D,
                             DIDumpOptions DumpOpts)
    : OS(S), DCtx(D), DumpOpts(std::move(DumpOpts)), IsObjectFile(false),
      IsMachOObject(false) {
  if (const auto *F = DCtx.getDWARFObj().getFile()) {
    IsObjectFile = F->isRelocatableObject();
    IsMachOObject = F->isMachO();
  }
}